

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O2

_Bool Curl_pipeline_site_blacklisted(Curl_easy *handle,connectdata *conn)

{
  curl_llist_element *pcVar1;
  undefined8 *puVar2;
  int iVar3;
  curl_llist *pcVar4;
  
  if ((handle->multi != (Curl_multi *)0x0) &&
     (pcVar4 = Curl_multi_pipelining_site_bl(handle->multi), pcVar4 != (curl_llist *)0x0)) {
    while (pcVar1 = pcVar4->head, pcVar1 != (curl_llist_element *)0x0) {
      puVar2 = (undefined8 *)pcVar1->ptr;
      iVar3 = Curl_raw_equal((char *)*puVar2,(conn->host).name);
      if ((iVar3 != 0) && (conn->remote_port == (uint)*(ushort *)(puVar2 + 1))) {
        Curl_infof(handle,"Site %s:%d is pipeline blacklisted\n",(conn->host).name);
        return true;
      }
      pcVar4 = (curl_llist *)&pcVar1->next;
    }
  }
  return false;
}

Assistant:

bool Curl_pipeline_site_blacklisted(struct Curl_easy *handle,
                                    struct connectdata *conn)
{
  if(handle->multi) {
    struct curl_llist *blacklist =
      Curl_multi_pipelining_site_bl(handle->multi);

    if(blacklist) {
      struct curl_llist_element *curr;

      curr = blacklist->head;
      while(curr) {
        struct site_blacklist_entry *site;

        site = curr->ptr;
        if(Curl_raw_equal(site->hostname, conn->host.name) &&
           site->port == conn->remote_port) {
          infof(handle, "Site %s:%d is pipeline blacklisted\n",
                conn->host.name, conn->remote_port);
          return TRUE;
        }
        curr = curr->next;
      }
    }
  }
  return FALSE;
}